

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Message
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  long *plVar2;
  string *element_name;
  Type *proto_00;
  Type *proto_01;
  Type *pTVar3;
  iterator iVar4;
  mapped_type *ppFVar5;
  int i;
  long lVar6;
  int i_4;
  long lVar7;
  ulong uVar8;
  string lowercase_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
  name_to_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar7 = 0;
  for (lVar6 = 0; lVar6 < *(int *)(message + 0x48); lVar6 = lVar6 + 1) {
    lVar1 = *(long *)(message + 0x50);
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(proto->nested_type_).super_RepeatedPtrFieldBase,(int)lVar6);
    ValidateProto3Message(this,(Descriptor *)(lVar1 + lVar7),proto_00);
    lVar7 = lVar7 + 0xa8;
  }
  lVar7 = 0;
  for (lVar6 = 0; lVar6 < *(int *)(message + 0x58); lVar6 = lVar6 + 1) {
    lVar1 = *(long *)(message + 0x60);
    proto_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar6);
    ValidateProto3Enum(this,(EnumDescriptor *)(lVar1 + lVar7),proto_01);
    lVar7 = lVar7 + 0x38;
  }
  lVar7 = 0;
  for (lVar6 = 0; lVar6 < *(int *)(message + 0x2c); lVar6 = lVar6 + 1) {
    lVar1 = *(long *)(message + 0x30);
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(proto->field_).super_RepeatedPtrFieldBase,(int)lVar6);
    ValidateProto3Field(this,(FieldDescriptor *)(lVar1 + lVar7),pTVar3);
    lVar7 = lVar7 + 0xa8;
  }
  lVar7 = 0;
  for (lVar6 = 0; lVar6 < *(int *)(message + 0x78); lVar6 = lVar6 + 1) {
    lVar1 = *(long *)(message + 0x80);
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar6);
    ValidateProto3Field(this,(FieldDescriptor *)(lVar1 + lVar7),pTVar3);
    lVar7 = lVar7 + 0xa8;
  }
  if (0 < *(int *)(message + 0x68)) {
    AddError(this,*(string **)(message + 8),&proto->super_Message,OTHER,
             "Extension ranges are not allowed in proto3.");
  }
  if (*(char *)(*(long *)(message + 0x20) + 0x68) == '\x01') {
    AddError(this,*(string **)(message + 8),&proto->super_Message,OTHER,
             "MessageSet is not supported in proto3.");
  }
  name_to_field._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &name_to_field._M_t._M_impl.super__Rb_tree_header._M_header;
  name_to_field._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  name_to_field._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  name_to_field._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name_to_field._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       name_to_field._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar6 = 0; lVar6 < *(int *)(message + 0x2c); lVar6 = lVar6 + 1) {
    lVar7 = lVar6 * 0xa8;
    plVar2 = *(long **)(*(long *)(message + 0x30) + lVar7);
    lowercase_name._M_dataplus._M_p = (pointer)&lowercase_name.field_2;
    lowercase_name._M_string_length = 0;
    lowercase_name.field_2._M_local_buf[0] = '\0';
    for (uVar8 = 0; uVar8 < (ulong)plVar2[1]; uVar8 = uVar8 + 1) {
      if (*(char *)(*plVar2 + uVar8) != '_') {
        std::__cxx11::string::push_back((char)&lowercase_name);
      }
    }
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
            ::find(&name_to_field._M_t,&lowercase_name);
    if ((_Rb_tree_header *)iVar4._M_node == &name_to_field._M_t._M_impl.super__Rb_tree_header) {
      lVar1 = *(long *)(message + 0x30);
      ppFVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                              *)&name_to_field._M_t,&lowercase_name);
      *ppFVar5 = (mapped_type)(lVar1 + lVar7);
    }
    else {
      element_name = *(string **)(message + 8);
      std::operator+(&local_b0,"The JSON camel-case name of field \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (*(long *)(message + 0x30) + lVar7));
      std::operator+(&local_100,&local_b0,"\" conflicts with field \"");
      ppFVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                              *)&name_to_field._M_t,&lowercase_name);
      std::operator+(&local_90,&local_100,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)*ppFVar5
                    );
      std::operator+(&local_70,&local_90,"\". This is not ");
      std::operator+(&local_50,&local_70,"allowed in proto3.");
      AddError(this,element_name,&proto->super_Message,OTHER,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    std::__cxx11::string::~string((string *)&lowercase_name);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::~_Rb_tree(&name_to_field._M_t);
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Message(
    Descriptor* message, const DescriptorProto& proto) {
  for (int i = 0; i < message->nested_type_count(); ++i) {
    ValidateProto3Message(message->nested_types_ + i,
                                 proto.nested_type(i));
  }
  for (int i = 0; i < message->enum_type_count(); ++i) {
    ValidateProto3Enum(message->enum_types_ + i,
                              proto.enum_type(i));
  }
  for (int i = 0; i < message->field_count(); ++i) {
    ValidateProto3Field(message->fields_ + i, proto.field(i));
  }
  for (int i = 0; i < message->extension_count(); ++i) {
    ValidateProto3Field(message->extensions_ +i, proto.extension(i));
  }
  if (message->extension_range_count() > 0) {
    AddError(message->full_name(), proto,
             DescriptorPool::ErrorCollector::OTHER,
             "Extension ranges are not allowed in proto3.");
  }
  if (message->options().message_set_wire_format()) {
    // Using MessageSet doesn't make sense since we disallow extensions.
    AddError(message->full_name(), proto,
             DescriptorPool::ErrorCollector::OTHER,
             "MessageSet is not supported in proto3.");
  }

  // In proto3, we reject field names if they conflict in camelCase.
  // Note that we currently enforce a stricter rule: Field names must be
  // unique after being converted to lowercase with underscores removed.
  std::map<string, const FieldDescriptor*> name_to_field;
  for (int i = 0; i < message->field_count(); ++i) {
    string lowercase_name = ToLowercaseWithoutUnderscores(
        message->field(i)->name());
    if (name_to_field.find(lowercase_name) != name_to_field.end()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "The JSON camel-case name of field \"" +
               message->field(i)->name() + "\" conflicts with field \"" +
               name_to_field[lowercase_name]->name() + "\". This is not " +
               "allowed in proto3.");
    } else {
      name_to_field[lowercase_name] = message->field(i);
    }
  }
}